

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::CreateSafeUniqueObjectFileName(cmLocalGenerator *this,string *sin,string *dir_max)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmMakefile *this_00;
  _Alloc_hider __s2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_01;
  uint uVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar12;
  string ssin;
  string sssin;
  value_type e;
  string local_208;
  string *local_1e8;
  string local_1e0;
  cmLocalGenerator *local_1c0;
  string *local_1b8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_1b0;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  this_01 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             *)&this->UniqueObjectNamesMap;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_01,sin);
  p_Var1 = &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    pcVar2 = (sin->_M_dataplus)._M_p;
    local_1e8 = dir_max;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar2,pcVar2 + sin->_M_string_length);
    std::__cxx11::string::find_first_not_of((char)&local_208,0x2f);
    std::__cxx11::string::erase((ulong)&local_208,0);
    if ((_Base_ptr)local_208._M_string_length != (_Base_ptr)0x0) {
      p_Var9 = (_Base_ptr)0x0;
      do {
        if (local_208._M_dataplus._M_p[(long)p_Var9] == ':') {
          local_208._M_dataplus._M_p[(long)p_Var9] = '_';
        }
        p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 1);
      } while ((_Base_ptr)local_208._M_string_length != p_Var9);
    }
    cmsys::SystemTools::ReplaceString(&local_208,"../","__/");
    if ((_Base_ptr)local_208._M_string_length != (_Base_ptr)0x0) {
      p_Var9 = (_Base_ptr)0x0;
      do {
        if (local_208._M_dataplus._M_p[(long)p_Var9] == ' ') {
          local_208._M_dataplus._M_p[(long)p_Var9] = '_';
        }
        p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 1);
      } while ((_Base_ptr)local_208._M_string_length != p_Var9);
    }
    this_00 = this->Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_MANGLE_OBJECT_FILE_NAMES","");
    bVar4 = cmMakefile::IsOn(this_00,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4) {
      local_1a8._0_4_ = 0x5f705f;
      cmsys::SystemTools::ReplaceString(&local_208,"+",local_1a8);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      pcVar2 = (sin->_M_dataplus)._M_p;
      local_1b8 = sin;
      local_1b0 = this_01;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar2,pcVar2 + sin->_M_string_length);
      p_Var7 = (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1c0 = this;
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        uVar10 = 0;
        do {
          sVar3 = local_208._M_string_length;
          __s2._M_p = local_208._M_dataplus._M_p;
          bVar4 = true;
          do {
            p_Var9 = p_Var7[2]._M_parent;
            if (p_Var9 == (_Base_ptr)sVar3) {
              if (p_Var9 == (_Base_ptr)0x0) {
                bVar4 = false;
              }
              else {
                iVar5 = bcmp(*(void **)(p_Var7 + 2),__s2._M_p,(size_t)p_Var9);
                if (iVar5 == 0) {
                  bVar4 = false;
                }
              }
            }
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != p_Var1);
          if (bVar4) break;
          std::__cxx11::string::_M_assign((string *)&local_1e0);
          cmsys::SystemTools::ReplaceString(&local_208,"_p_",local_1a8);
          sprintf(local_1a8,"_p%d_",(ulong)uVar10);
          p_Var7 = (local_1c0->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
          uVar10 = uVar10 + 1;
        } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      }
      this = local_1c0;
      this_01 = local_1b0;
      sin = local_1b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        this = local_1c0;
        this_01 = local_1b0;
        sin = local_1b8;
      }
    }
    bVar4 = cmLocalGeneratorCheckObjectName
                      (&local_208,local_1e8->_M_string_length,this->ObjectPathMax);
    if ((!bVar4) &&
       (pVar11 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&this->ObjectMaxPathViolations,local_1e8),
       ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The object file directory\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1e8->_M_dataplus)._M_p,
                          local_1e8->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"has ",4);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," characters.  ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"The maximum full path to an object file is ",0x2b);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," characters ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"(see CMAKE_OBJECT_PATH_MAX).  ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Object file\n",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"cannot be safely placed under this directory.  ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"The build may not work correctly.",0x21);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,WARNING,&local_1e0,
                          &this->DirectoryBacktrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1a8,sin,&local_208);
    pVar12 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                       (this_01,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_1a8);
    iVar6._M_node = (_Base_ptr)pVar12.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != local_178) {
      operator_delete(local_188._M_p,local_178[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  return (string *)(iVar6._M_node + 2);
}

Assistant:

std::string& cmLocalGenerator::CreateSafeUniqueObjectFileName(
  const std::string& sin, std::string const& dir_max)
{
  // Look for an existing mapped name for this object file.
  std::map<std::string, std::string>::iterator it =
    this->UniqueObjectNamesMap.find(sin);

  // If no entry exists create one.
  if (it == this->UniqueObjectNamesMap.end()) {
    // Start with the original name.
    std::string ssin = sin;

    // Avoid full paths by removing leading slashes.
    ssin.erase(0, ssin.find_first_not_of('/'));

    // Avoid full paths by removing colons.
    std::replace(ssin.begin(), ssin.end(), ':', '_');

    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(ssin, "../", "__/");

    // Avoid spaces.
    std::replace(ssin.begin(), ssin.end(), ' ', '_');

    // Mangle the name if necessary.
    if (this->Makefile->IsOn("CMAKE_MANGLE_OBJECT_FILE_NAMES")) {
      bool done;
      int cc = 0;
      char rpstr[100];
      sprintf(rpstr, "_p_");
      cmSystemTools::ReplaceString(ssin, "+", rpstr);
      std::string sssin = sin;
      do {
        done = true;
        for (it = this->UniqueObjectNamesMap.begin();
             it != this->UniqueObjectNamesMap.end(); ++it) {
          if (it->second == ssin) {
            done = false;
          }
        }
        if (done) {
          break;
        }
        sssin = ssin;
        cmSystemTools::ReplaceString(ssin, "_p_", rpstr);
        sprintf(rpstr, "_p%d_", cc++);
      } while (!done);
    }

#if defined(CM_LG_ENCODE_OBJECT_NAMES)
    if (!cmLocalGeneratorCheckObjectName(ssin, dir_max.size(),
                                         this->ObjectPathMax)) {
      // Warn if this is the first time the path has been seen.
      if (this->ObjectMaxPathViolations.insert(dir_max).second) {
        std::ostringstream m;
        /* clang-format off */
        m << "The object file directory\n"
          << "  " << dir_max << "\n"
          << "has " << dir_max.size() << " characters.  "
          << "The maximum full path to an object file is "
          << this->ObjectPathMax << " characters "
          << "(see CMAKE_OBJECT_PATH_MAX).  "
          << "Object file\n"
          << "  " << ssin << "\n"
          << "cannot be safely placed under this directory.  "
          << "The build may not work correctly.";
        /* clang-format on */
        this->IssueMessage(cmake::WARNING, m.str());
      }
    }
#else
    (void)dir_max;
#endif

    // Insert the newly mapped object file name.
    std::map<std::string, std::string>::value_type e(sin, ssin);
    it = this->UniqueObjectNamesMap.insert(e).first;
  }

  // Return the map entry.
  return it->second;
}